

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::CDEFBlockHighbdTest_TestSIMDHighbdNoMismatch_Test>::
CreateTest(ParameterizedTestFactory<(anonymous_namespace)::CDEFBlockHighbdTest_TestSIMDHighbdNoMismatch_Test>
           *this)

{
  Test *this_00;
  long in_RDI;
  
  WithParamInterface<std::tuple<std::array<void_(*)(void_*,_int,_const_unsigned_short_*,_int,_int,_int,_int,_int,_int,_int,_int),_4UL>,_std::array<void_(*)(void_*,_int,_const_unsigned_short_*,_int,_int,_int,_int,_int,_int,_int,_int),_4UL>,_BLOCK_SIZE,_int,_int>_>
  ::SetParam((ParamType *)(in_RDI + 8));
  this_00 = (Test *)operator_new(0x68);
  anon_unknown.dwarf_108b30::CDEFBlockHighbdTest_TestSIMDHighbdNoMismatch_Test::
  CDEFBlockHighbdTest_TestSIMDHighbdNoMismatch_Test
            ((CDEFBlockHighbdTest_TestSIMDHighbdNoMismatch_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }